

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_substr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  jx9_value *pjVar6;
  int nSrcLen;
  int local_2c;
  
  if ((nArg < 2) || (pcVar3 = jx9_value_to_string(*apArg,&local_2c), local_2c < 1)) {
LAB_0012fe41:
    pjVar6 = pCtx->pRet;
    jx9MemObjRelease(pjVar6);
    (pjVar6->x).rVal = 0.0;
    pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 8;
    return 0;
  }
  pjVar6 = apArg[1];
  jx9MemObjToInteger(pjVar6);
  uVar1 = *(uint *)&pjVar6->x;
  if ((int)uVar1 < 0) {
    uVar4 = local_2c + uVar1;
    iVar5 = 0;
    if ((int)uVar4 < 0) goto LAB_0012fe41;
  }
  else {
    iVar5 = local_2c;
    uVar4 = uVar1;
    if (local_2c <= (int)uVar1) goto LAB_0012fe41;
  }
  if (nArg == 2) {
    iVar2 = iVar5 - uVar1;
  }
  else {
    pjVar6 = apArg[2];
    jx9MemObjToInteger(pjVar6);
    iVar5 = *(int *)&pjVar6->x;
    if (iVar5 == 0) {
      pjVar6 = pCtx->pRet;
      pcVar3 = "";
      iVar2 = 0;
      goto LAB_0012fecd;
    }
    if (iVar5 < 0) {
      iVar2 = (iVar5 - uVar4) + local_2c;
      iVar5 = local_2c - uVar4;
      if (0 < iVar2) {
        iVar5 = iVar2;
      }
    }
    iVar2 = local_2c - uVar4;
    if ((int)(iVar5 + uVar4) <= local_2c) {
      iVar2 = iVar5;
    }
  }
  pcVar3 = pcVar3 + uVar4;
  pjVar6 = pCtx->pRet;
LAB_0012fecd:
  jx9_value_string(pjVar6,pcVar3,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_substr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zSource, *zOfft;
	int nOfft, nLen, nSrcLen;	
	if( nArg < 2 ){
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zSource = jx9_value_to_string(apArg[0], &nSrcLen);
	if( nSrcLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = nSrcLen; /* cc warning */
	/* Extract the offset */
	nOfft = jx9_value_to_int(apArg[1]);
	if( nOfft < 0 ){
		zOfft = &zSource[nSrcLen+nOfft]; 
		if( zOfft < zSource ){
			/* Invalid offset */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nLen = (int)(&zSource[nSrcLen]-zOfft);
		nOfft = (int)(zOfft-zSource);
	}else if( nOfft >= nSrcLen ){
		/* Invalid offset */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}else{
		zOfft = &zSource[nOfft];
		nLen = nSrcLen - nOfft;
	}
	if( nArg > 2 ){
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[2]);
		if( nLen == 0 ){
			/* Invalid length, return an empty string */
			jx9_result_string(pCtx, "", 0);
			return JX9_OK;
		}else if( nLen < 0 ){
			nLen = nSrcLen + nLen - nOfft;
			if( nLen < 1 ){
				/* Invalid  length */
				nLen = nSrcLen - nOfft;
			}
		}
		if( nLen + nOfft > nSrcLen ){
			/* Invalid length */
			nLen = nSrcLen - nOfft;
		}
	}
	/* Return the substring */
	jx9_result_string(pCtx, zOfft, nLen);
	return JX9_OK;
}